

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_udata.c
# Opt level: O3

void * lj_lightud_intern(lua_State *L,void *p)

{
  uint64_t uVar1;
  uint uVar2;
  void *p_00;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar1 = (L->glref).ptr64;
  uVar6 = (uint)((ulong)p >> 0x20) & 0xffffff80;
  p_00 = *(void **)(uVar1 + 0x70);
  uVar4 = (ulong)*(byte *)(uVar1 + 0x23);
  if (p_00 != (void *)0x0) {
    uVar4 = uVar4 + 1;
    uVar5 = 0;
    do {
      if (*(uint *)((long)p_00 + uVar5 * 4) == uVar6) goto LAB_001126d7;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
    if (0xfd < *(byte *)(uVar1 + 0x23)) {
      lj_err_msg(L,LJ_ERR_BADLU);
    }
  }
  uVar2 = (uint)uVar4;
  if (uVar2 != 1 && (uVar2 & uVar2 - 1) == 0) {
    iVar3 = 2;
    if (uVar4 != 0) {
      iVar3 = uVar2 * 2;
    }
    p_00 = lj_mem_realloc(L,p_00,(ulong)(uVar2 * 4),(ulong)(uint)(iVar3 << 2));
    *(void **)(uVar1 + 0x70) = p_00;
  }
  *(char *)(uVar1 + 0x23) = (char)uVar4;
  *(uint *)((long)p_00 + uVar4 * 4) = uVar6;
  uVar5 = uVar4;
LAB_001126d7:
  return (void *)((ulong)p & 0x7fffffffff | uVar5 << 0x27);
}

Assistant:

void *lj_lightud_intern(lua_State *L, void *p)
{
  global_State *g = G(L);
  uint64_t u = (uint64_t)p;
  uint32_t up = lightudup(u);
  uint32_t *segmap = mref(g->gc.lightudseg, uint32_t);
  MSize segnum = g->gc.lightudnum;
  if (segmap) {
    MSize seg;
    for (seg = 0; seg <= segnum; seg++)
      if (segmap[seg] == up)  /* Fast path. */
	return (void *)(((uint64_t)seg << LJ_LIGHTUD_BITS_LO) | lightudlo(u));
    segnum++;
    /* Leave last segment unused to avoid clash with ITERN key. */
    if (segnum >= (1 << LJ_LIGHTUD_BITS_SEG)-1) lj_err_msg(L, LJ_ERR_BADLU);
  }
  if (!((segnum-1) & segnum) && segnum != 1) {
    lj_mem_reallocvec(L, segmap, segnum, segnum ? 2*segnum : 2u, uint32_t);
    setmref(g->gc.lightudseg, segmap);
  }
  g->gc.lightudnum = segnum;
  segmap[segnum] = up;
  return (void *)(((uint64_t)segnum << LJ_LIGHTUD_BITS_LO) | lightudlo(u));
}